

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall
CTcTokenizer::pp_parse_expr
          (CTcTokenizer *this,CTcConstVal *val,int read_first,int last_on_line,int add_line_ending)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  tc_toktyp_t tVar4;
  int iVar5;
  int iVar6;
  CTcPrsNode *pCVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar9;
  
  if (add_line_ending != 0) {
    (*(this->expbuf_)._vptr_CTcTokString[2])(&this->expbuf_,(this->expbuf_).buf_len_ + 1);
    (this->expbuf_).buf_[(this->expbuf_).buf_len_] = '\x04';
    sVar1 = (this->expbuf_).buf_len_;
    (this->expbuf_).buf_len_ = sVar1 + 1;
    (this->expbuf_).buf_[sVar1 + 1] = '\0';
  }
  *(byte *)this = *(byte *)this | 0x20;
  G_prs->field_0xec = G_prs->field_0xec | 1;
  if (read_first != 0) {
    next(this);
  }
  pCVar7 = CTcParser::parse_expr(G_prs);
  if (last_on_line != 0) {
    tVar4 = next(this);
    if (tVar4 != TOKT_EOF) {
      log_error(0x2727);
    }
  }
  if (add_line_ending != 0) {
    uVar8 = (this->expbuf_).buf_len_ - 1;
    (this->expbuf_).buf_len_ = uVar8;
    if (uVar8 < (this->expbuf_).buf_size_) {
      (this->expbuf_).buf_[uVar8] = '\0';
    }
  }
  G_prs->field_0xec = G_prs->field_0xec & 0xfe;
  *(byte *)this = *(byte *)this & 0xdf;
  iVar6 = 1;
  if (pCVar7 != (CTcPrsNode *)0x0) {
    iVar5 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar7);
    if (CONCAT44(extraout_var,iVar5) == 0) {
      log_error(0x2747);
    }
    else {
      iVar6 = (*(pCVar7->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar7);
      puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar6);
      lVar2 = puVar9[1];
      sVar1 = puVar9[2];
      uVar3 = puVar9[3];
      *(undefined8 *)val = *puVar9;
      (val->val_).intval_ = lVar2;
      (val->val_).floatval_.len_ = sVar1;
      *(undefined8 *)((long)&val->val_ + 0x10) = uVar3;
      val->field_0x20 = *(undefined1 *)(puVar9 + 4);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int CTcTokenizer::pp_parse_expr(CTcConstVal *val, int read_first,
                                int last_on_line, int add_line_ending)
{
    CTcPrsNode *expr_tree;
    char ch;
    
    /* add the line ending marker if required */
    if (add_line_ending)
    {
        /* 
         *   append the special end-of-preprocess-line to the macro
         *   expansion buffer 
         */
        ch = TOK_END_PP_LINE;
        expbuf_.append(&ch, 1);
    }

    /* 
     *   note that we're pasing a preprocessor expression; this affects
     *   error logging in certain cases 
     */
    in_pp_expr_ = TRUE;

    /* 
     *   parse the expression in preprocessor mode, so that double-quoted
     *   strings can be concatenated and compared 
     */
    G_prs->set_pp_expr_mode(TRUE);

    /* get the first token on the line if desired */
    if (read_first)
        next();

    /* parse the expression */
    expr_tree = G_prs->parse_expr();

    /* make sure we're at the end of the line if desired */
    if (last_on_line && next() != TOKT_EOF)
        log_error(TCERR_PP_EXPR_EXTRA);

    /* if we added the special pp-line-ending marker, remove it */
    if (add_line_ending)
    {
        /* 
         *   the marker is always the last character - remove it simply by
         *   shortening the buffer by a character 
         */
        expbuf_.set_text_len(expbuf_.get_text_len() - 1);
    }

    /* return to normal expression mode */
    G_prs->set_pp_expr_mode(FALSE);

    /* return to normal tokenizing mode */
    in_pp_expr_ = FALSE;

    /* if we didn't get a valid expression, return failure */
    if (expr_tree == 0)
        return 1;

    /* make sure we got a constant */
    if (!expr_tree->is_const())
    {
        log_error(TCERR_PP_EXPR_NOT_CONST);
        return 1;
    }

    /* fill in the caller's value */
    *val = *expr_tree->get_const_val();

    /* success */
    return 0;
}